

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void cppurses::output::put(Glyph *g)

{
  byte bVar1;
  short sVar2;
  short fg;
  uint result;
  uint uVar3;
  long lVar4;
  uint uVar5;
  wchar_t symbol [2];
  cchar_t symbol_and_attributes;
  wchar_t local_40 [2];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  uVar3 = 0;
  fg = 0;
  sVar2 = 0;
  if ((g->brush).background_color_.initialized_ != false) {
    sVar2 = *(short *)(g->brush).background_color_.storage_.data_;
  }
  if ((g->brush).foreground_color_.initialized_ != false) {
    fg = *(short *)(g->brush).foreground_color_.storage_.data_;
  }
  sVar2 = Terminal::color_index((Terminal *)System::terminal,fg,sVar2);
  lVar4 = 0;
  do {
    bVar1 = (&Attribute_list)[lVar4];
    if (((g->brush).attributes_.super__Base_bitset<1UL>._M_w >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
      uVar5 = 0;
      if (bVar1 < 8) {
        uVar5 = *(uint *)(&DAT_001533d0 + (ulong)bVar1 * 4);
      }
      uVar3 = uVar3 | uVar5;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  local_40[0] = g->symbol;
  local_40[1] = 0;
  uStack_28 = 0;
  uStack_24 = 0;
  local_38 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  setcchar(&local_38,local_40,uVar3,(int)sVar2,0);
  wadd_wchnstr(_stdscr,&local_38,1);
  return;
}

Assistant:

void put(const Glyph& g) {
#ifdef SLOW_PAINT
    paint_indicator('X');
#endif
#ifdef add_wchstr
    put_as_wchar(g);
#else  // If no wchar_t support in ncurses.
    put_as_char(g);
#endif
#ifdef SLOW_PAINT
    refresh();
    std::this_thread::sleep_for(std::chrono::milliseconds(SLOW_PAINT));
#endif
}